

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void __thiscall
FBitmap::CopyPixelData
          (FBitmap *this,int originx,int originy,BYTE *patch,int srcwidth,int srcheight,int step_x,
          int step_y,int rotate,PalEntry *palette,FCopyInfo *inf)

{
  int iVar1;
  BYTE *pBVar2;
  FCopyInfo *inf_00;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  PalEntry *pin;
  long lVar6;
  int srcheight_local;
  int srcwidth_local;
  int originy_local;
  int originx_local;
  BYTE *patch_local;
  PalEntry penew [256];
  
  srcheight_local = srcheight;
  srcwidth_local = srcwidth;
  originy_local = originy;
  originx_local = originx;
  patch_local = patch;
  bVar3 = ClipCopyPixelRect(&this->ClipRect,&originx_local,&originy_local,&patch_local,
                            &srcwidth_local,&srcheight_local,&step_x,&step_y,rotate);
  inf_00 = inf;
  pin = palette;
  if (bVar3) {
    lVar6 = (long)originx_local;
    iVar1 = this->Pitch;
    lVar5 = (long)originy_local;
    pBVar2 = this->data;
    memset(penew,0,0x400);
    if ((inf_00 != (FCopyInfo *)0x0) && (inf_00->blend != BLEND_NONE)) {
      iCopyColors<cPalEntry,cBGRA,bCopy>((BYTE *)penew,(BYTE *)pin,0x100,4,inf_00,'\0','\0','\0');
      pin = penew;
    }
    if (inf_00 == (FCopyInfo *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)inf_00->op;
    }
    (*copypalettedfuncs[uVar4])
              (pBVar2 + lVar5 * iVar1 + lVar6 * 4,patch_local,srcwidth_local,srcheight_local,
               this->Pitch,step_x,step_y,rotate,pin,inf_00);
  }
  return;
}

Assistant:

void FBitmap::CopyPixelData(int originx, int originy, const BYTE * patch, int srcwidth, int srcheight, 
										int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	if (ClipCopyPixelRect(&ClipRect, originx, originy, patch, srcwidth, srcheight, step_x, step_y, rotate))
	{
		BYTE *buffer = data + 4*originx + Pitch*originy;
		PalEntry penew[256];

		memset(penew, 0, sizeof(penew));
		if (inf && inf->blend)
		{
			iCopyColors<cPalEntry, cBGRA, bCopy>((BYTE*)penew, (const BYTE*)palette, 256, 4, inf, 0, 0, 0);
			palette = penew;
		}

		copypalettedfuncs[inf==NULL? OP_COPY : inf->op](buffer, patch, srcwidth, srcheight, Pitch, 
														step_x, step_y, rotate, palette, inf);
	}
}